

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bandit_run_policy.h
# Opt level: O0

bool __thiscall
bandit::detail::bandit_run_policy::matches_only_pattern(bandit_run_policy *this,char *name)

{
  bool bVar1;
  allocator local_39;
  string local_38 [8];
  string n;
  char *name_local;
  bandit_run_policy *this_local;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,name,&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  bVar1 = matches_only_pattern(this,(string *)local_38);
  std::__cxx11::string::~string(local_38);
  return bVar1;
}

Assistant:

bool matches_only_pattern(const char* name) const
    {
      std::string n(name);
      return matches_only_pattern(n);
    }